

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (layer == ImGuiNavLayer_Main) {
    pIVar3 = GImGui->NavWindow->NavLastChildNavWindow;
    if ((pIVar3 == (ImGuiWindow *)0x0) || (pIVar3->WasActive == false)) {
      pIVar3 = GImGui->NavWindow;
    }
    GImGui->NavWindow = pIVar3;
  }
  pIVar3 = pIVar2->NavWindow;
  IVar1 = pIVar3->NavLastIds[layer];
  if (IVar1 != 0) {
    pIVar2->NavId = IVar1;
    pIVar2->NavLayer = layer;
    pIVar2->NavFocusScopeId = 0;
    pIVar3->NavLastIds[layer] = IVar1;
    return;
  }
  pIVar2->NavLayer = layer;
  NavInitWindow(pIVar3,true);
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}